

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_rules_tria.cc
# Opt level: O0

QuadRule * lf::quad::detail::HardcodedQuadRule<(lf::base::RefElType)3,6>(void)

{
  Scalar *pSVar1;
  Scalar *pSVar2;
  QuadRule *in_RDI;
  Matrix<double,__1,_1,_0,__1,_1> local_80;
  Matrix<double,__1,__1,_0,__1,__1> local_70;
  RefEl local_55;
  int local_44;
  undefined1 local_40 [8];
  VectorXd weights;
  undefined1 local_28 [8];
  MatrixXd points;
  
  weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = 2;
  weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_4_ =
       0xc;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_28,
             (int *)((long)&weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows + 4),
             (int *)&weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows);
  local_44 = 0xc;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_40,&local_44);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,0);
  *pSVar1 = 0.2194299825497829;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,0);
  *pSVar1 = 0.2194299825497831;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,1);
  *pSVar1 = 0.561140034900434;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,1);
  *pSVar1 = 0.21942998254978296;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,2);
  *pSVar1 = 0.21942998254978302;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,2);
  *pSVar1 = 0.5611400349004342;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,3);
  *pSVar1 = 0.48013796411221504;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,3);
  *pSVar1 = 0.03972407177556996;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,4);
  *pSVar1 = 0.4801379641122151;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,4);
  *pSVar1 = 0.48013796411221504;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,5);
  *pSVar1 = 0.039724071775569886;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,5);
  *pSVar1 = 0.48013796411221527;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,6);
  *pSVar1 = 0.14161901592396814;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,6);
  *pSVar1 = 0.01937172436124081;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,7);
  *pSVar1 = 0.839009259714791;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,7);
  *pSVar1 = 0.1416190159239681;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,8);
  *pSVar1 = 0.01937172436124096;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,8);
  *pSVar1 = 0.8390092597147911;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,9);
  *pSVar1 = 0.8390092597147911;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,9);
  *pSVar1 = 0.01937172436124081;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,10)
  ;
  *pSVar1 = 0.14161901592396814;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,10)
  ;
  *pSVar1 = 0.8390092597147912;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,0xb
                     );
  *pSVar1 = 0.019371724361240558;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,0xb
                     );
  *pSVar1 = 0.14161901592396844;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,0);
  *pSVar2 = 0.0856665620764905;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,1);
  *pSVar2 = 0.0856665620764905;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,2);
  *pSVar2 = 0.0856665620764905;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,3);
  *pSVar2 = 0.04036554479651548;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,4);
  *pSVar2 = 0.04036554479651548;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,5);
  *pSVar2 = 0.04036554479651548;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,6);
  *pSVar2 = 0.020317279896830326;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,7);
  *pSVar2 = 0.020317279896830326;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,8);
  *pSVar2 = 0.020317279896830326;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,9);
  *pSVar2 = 0.020317279896830326;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,10);
  *pSVar2 = 0.020317279896830326;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,0xb);
  *pSVar2 = 0.020317279896830326;
  local_55 = lf::base::RefEl::kTria();
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            (&local_70,(Matrix<double,__1,__1,_0,__1,__1> *)local_28);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            (&local_80,(Matrix<double,__1,_1,_0,__1,_1> *)local_40);
  QuadRule::QuadRule(in_RDI,local_55,&local_70,&local_80,6);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_80);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_70);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_40);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_28);
  return in_RDI;
}

Assistant:

QuadRule HardcodedQuadRule<base::RefEl::kTria(), 6>() { // NOLINT
  Eigen::MatrixXd points(2, 12);
  Eigen::VectorXd weights(12);

  points(0, 0) = 0.21942998254978290928;
  points(1, 0) = 0.21942998254978310357;
  points(0, 1) = 0.56114003490043395939;
  points(1, 1) = 0.2194299825497829648;
  points(0, 2) = 0.21942998254978302031;
  points(1, 2) = 0.56114003490043418143;
  points(0, 3) = 0.48013796411221504323;
  points(1, 3) = 0.039724071775569962106;
  points(0, 4) = 0.48013796411221509874;
  points(1, 4) = 0.48013796411221504323;
  points(0, 5) = 0.039724071775569885778;
  points(1, 5) = 0.48013796411221526528;
  points(0, 6) = 0.14161901592396813898;
  points(1, 6) = 0.019371724361240811457;
  points(0, 7) = 0.8390092597147910114;
  points(1, 7) = 0.14161901592396811123;
  points(0, 8) = 0.019371724361240960643;
  points(1, 8) = 0.83900925971479112242;
  points(0, 9) = 0.83900925971479112242;
  points(1, 9) = 0.019371724361240811457;
  points(0, 10) = 0.14161901592396813898;
  points(1, 10) = 0.83900925971479123344;
  points(0, 11) = 0.019371724361240558188;
  points(1, 11) = 0.14161901592396844429;

  weights(0) = 0.085666562076490496147;
  weights(1) = 0.085666562076490496147;
  weights(2) = 0.085666562076490496147;
  weights(3) = 0.040365544796515481774;
  weights(4) = 0.040365544796515481774;
  weights(5) = 0.040365544796515481774;
  weights(6) = 0.020317279896830325869;
  weights(7) = 0.020317279896830325869;
  weights(8) = 0.020317279896830325869;
  weights(9) = 0.020317279896830325869;
  weights(10) = 0.020317279896830325869;
  weights(11) = 0.020317279896830325869;

  return QuadRule(base::RefEl::kTria(), std::move(points), std::move(weights), 6);
}